

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int INT_CMfork_comm_thread(CManager_conflict cm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FILE *pFVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  pthread_t pVar7;
  CMControlList p_Var8;
  timespec ts;
  
  p_Var8 = cm->control_list;
  if (p_Var8->select_initialized == 0) {
    CM_init_select(p_Var8,cm);
    p_Var8 = cm->control_list;
  }
  iVar4 = 1;
  if (p_Var8->has_thread == 0) {
    if ((p_Var8->network_blocking_function).func == (CMPollFunc)0x0) {
      pVar6 = thr_fork(CM_test_thread_func,cm);
      if (pVar6 != 0) {
        iVar4 = CMtrace_val[3];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(cm,CMLowLevelVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar3 = (FILE *)cm->CMTrace_file;
            _Var5 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fwrite("CM - Will fork comm thread later\n",0x21,1,(FILE *)cm->CMTrace_file);
        }
        fflush((FILE *)cm->CMTrace_file);
        cm->control_list->has_thread = -1;
        return 1;
      }
      iVar4 = CMtrace_val[3];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,CMLowLevelVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar3 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar7 = pthread_self();
          fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fwrite("CM - Test fork failed, no comm thread\n",0x26,1,(FILE *)cm->CMTrace_file);
      }
      fflush((FILE *)cm->CMTrace_file);
    }
    else {
      pVar6 = thr_fork(server_thread_func,cm);
      iVar4 = CMtrace_val[3];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,CMLowLevelVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar3 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar7 = pthread_self();
          fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"CM - Forked comm thread %p\n",pVar6);
      }
      fflush((FILE *)cm->CMTrace_file);
      if (pVar6 != 0) {
        p_Var8 = cm->control_list;
        p_Var8->server_thread = pVar6;
        p_Var8->has_thread = 1;
        cm->reference_count = cm->reference_count + 1;
        iVar4 = CMtrace_val[7];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(cm,CMFreeVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar3 = (FILE *)cm->CMTrace_file;
            _Var5 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"Forked - CManager %p ref count now %d\n",cm,
                  (ulong)(uint)cm->reference_count);
        }
        fflush((FILE *)cm->CMTrace_file);
        p_Var8 = cm->control_list;
        uVar1 = p_Var8->cl_reference_count;
        uVar2 = p_Var8->free_reference_count;
        p_Var8->cl_reference_count = uVar1 + 1;
        p_Var8->free_reference_count = uVar2 + 1;
        return 1;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
INT_CMfork_comm_thread(CManager cm)
{
    /* if we're on a kernel-level-threads package, for the thread and 
       return 1, else return 0; */
    if (!cm->control_list->select_initialized) {
	CM_init_select(cm->control_list, cm);
    }
    if (cm->control_list->has_thread == 0) {
	if (cm->control_list->network_blocking_function.func) {
	    thr_thread_t server_thread = 
		thr_fork((void*(*)(void*))server_thread_func, 
			 (void*)cm);
	    CMtrace_out(cm, CMLowLevelVerbose,
			"CM - Forked comm thread %p\n", (void*)(intptr_t)server_thread);
	    if (server_thread ==  (thr_thread_t)(intptr_t) NULL) {
		return 0;
	    }
	    cm->control_list->server_thread = thr_get_thread_id(server_thread);
	    cm->control_list->has_thread = 1;
	    cm->reference_count++;
	    CMtrace_out(cm, CMFreeVerbose, "Forked - CManager %p ref count now %d\n", 
			cm, cm->reference_count);
	    cm->control_list->cl_reference_count++;
	    cm->control_list->free_reference_count++;
	} else {
	    /*
	     *  Can't start a server thread yet, but lets see 
	     *  if we can fork anything successfully.
	     */
	    thr_thread_t test_thread = 
		thr_fork((void*(*)(void*))CM_test_thread_func, 
			 (void*)cm);
	    if (test_thread ==  (thr_thread_t)(intptr_t) NULL) {
		/* No.  Say we can't. */
		CMtrace_out(cm, CMLowLevelVerbose,
			    "CM - Test fork failed, no comm thread\n");
		return 0;
	    }
	    /* OK, we'll fork it later. */
	    CMtrace_out(cm, CMLowLevelVerbose,
			"CM - Will fork comm thread later\n");
	    cm->control_list->has_thread = -1; /* should fork one */
	}
    }
    return 1;
}